

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O3

bool google::protobuf::internal::anon_unknown_36::HasLazyRep
               (FieldDescriptor *field,FieldOptions *options)

{
  byte bVar1;
  
  if (field->type_ != '\v') {
    return false;
  }
  bVar1 = field->field_0x1;
  if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
    return (short)options != 0 && (bVar1 & 0x20) == 0;
  }
  _GLOBAL__N_1::HasLazyRep();
}

Assistant:

bool HasLazyRep(const FieldDescriptor* field,
                const TailCallTableInfo::FieldOptions& options) {
  return field->type() == field->TYPE_MESSAGE && !field->is_repeated() &&
         options.lazy_opt != 0;
}